

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O2

void __thiscall ProblemAloha::InitializeAloha(ProblemAloha *this)

{
  int iVar1;
  Index IVar2;
  uint uVar3;
  Index IVar4;
  size_t *psVar5;
  ostream *poVar6;
  FSDist_COF *this_00;
  Scope *this_01;
  Scope *this_02;
  size_t sVar7;
  RewardModelMapping *this_03;
  reference ppRVar8;
  E *this_04;
  Index iI;
  ulong uVar9;
  char *pcVar10;
  Index j;
  Index newPacket_00;
  uint uVar11;
  double dVar12;
  allocator_type local_299;
  MADPComponentFactoredStates *local_298;
  vector<RewardModel_*,_std::allocator<RewardModel_*>_> *local_290;
  Index bI;
  pointer puStack_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  Index newPacket;
  pointer puStack_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  Scope ySc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> yVals;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrElems;
  vector<unsigned_int,_std::allocator<unsigned_int>_> emptyVec;
  string local_1d8 [32];
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  sVar7 = (size_t)*(uint *)&(this->super_FactoredDecPOMDPDiscrete).field_0x704;
  switch(sVar7) {
  case 0:
  case 2:
    sVar7 = 2;
    break;
  case 1:
    break;
  case 3:
  case 4:
  case 5:
    sVar7 = 3;
    break;
  case 6:
    sVar7 = 5;
    break;
  case 7:
  case 8:
    sVar7 = 4;
    break;
  case 9:
    sVar7 = 6;
    break;
  case 10:
    sVar7 = 7;
    break;
  case 0xb:
    sVar7 = this->_m_nrAgentsPassedOnCommandline;
    break;
  default:
    this_04 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_04,"InitializeAloha() island config not handled");
    __cxa_throw(this_04,&E::typeinfo,E::~E);
  }
  this->_m_nrIslands = sVar7;
  MultiAgentDecisionProcess::SetNrAgents((MultiAgentDecisionProcess *)this,sVar7);
  (**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                         super_MultiAgentDecisionProcessDiscreteFactoredStates.
                         super_MultiAgentDecisionProcess + 0x318))(&ss,this);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              _m_name._m_name);
  std::__cxx11::string::~string((string *)&ss);
  (**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                         super_MultiAgentDecisionProcessDiscreteFactoredStates.
                         super_MultiAgentDecisionProcess + 800))(&ss,this);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              _m_name._m_description);
  std::__cxx11::string::~string((string *)&ss);
  (**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                         super_MultiAgentDecisionProcessDiscreteFactoredStates.
                         super_MultiAgentDecisionProcess + 0x318))(local_1d8,this);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              _m_unixName);
  std::__cxx11::string::~string(local_1d8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&nrElems,2,(allocator_type *)&ss);
  *nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start =
       *(unsigned_long *)&(this->super_FactoredDecPOMDPDiscrete).field_0x710;
  nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 2;
  psVar5 = IndexTools::CalculateStepSize(&nrElems);
  this->_m_stepSizeState = psVar5;
  *nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 2;
  psVar5 = IndexTools::CalculateStepSize(&nrElems);
  this->_m_stepSizeObservations = psVar5;
  local_298 = &(this->super_FactoredDecPOMDPDiscrete).
               super_MultiAgentDecisionProcessDiscreteFactoredStates._m_S;
  for (uVar3 = 0; (ulong)uVar3 < this->_m_nrIslands; uVar3 = uVar3 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ySc,"BL",(allocator<char> *)&emptyVec);
    StringTools::Append((string *)&ss,(string *)&ySc,uVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&newPacket,"The back log of island ",(allocator<char> *)&yVals);
    StringTools::Append((string *)&bI,(string *)&newPacket,uVar3);
    IVar2 = MADPComponentFactoredStates::AddStateFactor(local_298,(string *)&ss,(string *)&bI);
    local_290 = (vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)
                CONCAT44(local_290._4_4_,IVar2);
    std::__cxx11::string::~string((string *)&bI);
    std::__cxx11::string::~string((string *)&newPacket);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::string::~string((string *)&ySc);
    uVar11 = *(uint *)&(this->super_FactoredDecPOMDPDiscrete).field_0x708;
    if (uVar11 - 1 < 3) {
      for (uVar11 = 0;
          *(long *)&(this->super_FactoredDecPOMDPDiscrete).field_0x710 * 2 + 2U != (ulong)uVar11;
          uVar11 = uVar11 + 1) {
        splitState(this,uVar11,&bI,&newPacket);
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar6 = std::operator<<((ostream *)local_1a8[0]._M_local_buf,"bl");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        pcVar10 = "newP";
        if (newPacket == 0) {
          pcVar10 = "none";
        }
        std::operator<<((ostream *)local_1a8[0]._M_local_buf,pcVar10);
        std::__cxx11::stringbuf::str();
        MADPComponentFactoredStates::AddStateFactorValue(local_298,(Index)local_290,(string *)&ySc);
        std::__cxx11::string::~string((string *)&ySc);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      }
    }
    else if (uVar11 == 0) {
      for (; (ulong)uVar11 <= *(ulong *)&(this->super_FactoredDecPOMDPDiscrete).field_0x710;
          uVar11 = uVar11 + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ySc,"bl",(allocator<char> *)&bI);
        StringTools::Append((string *)&ss,(string *)&ySc,uVar11);
        MADPComponentFactoredStates::AddStateFactorValue(local_298,(Index)local_290,(string *)&ss);
        std::__cxx11::string::~string((string *)&ss);
        std::__cxx11::string::~string((string *)&ySc);
      }
    }
  }
  MADPComponentFactoredStates::SetInitialized(local_298,true);
  this_00 = (FSDist_COF *)operator_new(0x48);
  FSDist_COF::FSDist_COF
            (this_00,(MultiAgentDecisionProcessDiscreteFactoredStatesInterface *)
                     (&(this->super_FactoredDecPOMDPDiscrete).
                       super_MultiAgentDecisionProcessDiscreteFactoredStates.
                       super_MultiAgentDecisionProcess.field_0x0 +
                     *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                         super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                         super_MultiAgentDecisionProcess + -0x48)));
  uVar9 = 0;
  do {
    if (this->_m_nrIslands <= uVar9) {
      (this->super_FactoredDecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscreteFactoredStates.
      _m_S._m_initialStateDistribution = (FactoredStateDistribution *)this_00;
      ConstructActions(this);
      MADPComponentDiscreteActions::SetInitialized
                (&(this->super_FactoredDecPOMDPDiscrete).
                  super_MultiAgentDecisionProcessDiscreteFactoredStates._m_A,true);
      ConstructObservations(this);
      MADPComponentDiscreteObservations::SetInitialized
                (&(this->super_FactoredDecPOMDPDiscrete).
                  super_MultiAgentDecisionProcessDiscreteFactoredStates._m_O,true);
      (**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                             super_MultiAgentDecisionProcessDiscreteFactoredStates.
                             super_MultiAgentDecisionProcess + 0x240))(this);
      (this->super_FactoredDecPOMDPDiscrete)._m_nrLRFs = this->_m_nrIslands;
      FactoredDecPOMDPDiscrete::InitializeStorage(&this->super_FactoredDecPOMDPDiscrete);
      uVar9 = 0;
      while (IVar2 = (Index)uVar9, uVar9 < this->_m_nrIslands) {
        local_1a8[0]._M_allocated_capacity = 0;
        ySc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        _ss = (pointer)0x0;
        ySc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        ySc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        Scope::Insert(&ySc,IVar2);
        local_278._M_allocated_capacity = 0;
        _bI = (pointer)0x0;
        puStack_280 = (pointer)0x0;
        Scope::Insert((Scope *)&bI,IVar2);
        FactoredDecPOMDPDiscrete::SetScopeForLRF
                  (&this->super_FactoredDecPOMDPDiscrete,IVar2,(Scope *)&ss,(Scope *)&bI,&ySc,
                   (Scope *)&ss);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bI);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&ySc);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&ss);
        uVar9 = (ulong)(IVar2 + 1);
      }
      FactoredDecPOMDPDiscrete::InitializeInstantiationInformation
                (&this->super_FactoredDecPOMDPDiscrete);
      local_290 = &(this->super_FactoredDecPOMDPDiscrete)._m_LRFs;
      for (uVar3 = 0; (ulong)uVar3 < this->_m_nrIslands; uVar3 = uVar3 + 1) {
        local_278._M_allocated_capacity = 0;
        local_258._M_allocated_capacity = 0;
        _bI = (pointer)0x0;
        puStack_280 = (pointer)0x0;
        _newPacket = (pointer)0x0;
        puStack_260 = (pointer)0x0;
        Scope::Insert((Scope *)&newPacket,uVar3);
        this_01 = (Scope *)(**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                                  super_MultiAgentDecisionProcessDiscreteFactoredStates
                                                  .super_MultiAgentDecisionProcess + 0x280))
                                     (this,uVar3);
        this_02 = (Scope *)(**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                                  super_MultiAgentDecisionProcessDiscreteFactoredStates
                                                  .super_MultiAgentDecisionProcess + 0x288))
                                     (this,uVar3);
        Scope::SoftPrint_abi_cxx11_((string *)&ss,this_01);
        Scope::SoftPrint_abi_cxx11_((string *)&ySc,this_02);
        local_298 = (MADPComponentFactoredStates *)
                    FactoredDecPOMDPDiscrete::GetNrXIs(&this->super_FactoredDecPOMDPDiscrete,uVar3);
        sVar7 = FactoredDecPOMDPDiscrete::GetNrAIs(&this->super_FactoredDecPOMDPDiscrete,uVar3);
        this_03 = (RewardModelMapping *)operator_new(0x80);
        RewardModelMapping::RewardModelMapping
                  (this_03,(size_t)local_298,sVar7,(string *)&ss,(string *)&ySc);
        ppRVar8 = std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::at
                            (local_290,(ulong)uVar3);
        *ppRVar8 = (value_type)this_03;
        uVar9 = 0;
        while (IVar2 = (Index)uVar9,
              uVar9 <= *(ulong *)&(this->super_FactoredDecPOMDPDiscrete).field_0x710) {
          emptyVec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          emptyVec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          emptyVec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&yVals,1,&local_299);
          iVar1 = *(int *)&(this->super_FactoredDecPOMDPDiscrete).field_0x708;
          if (iVar1 - 1U < 3) {
            for (newPacket_00 = 0; newPacket_00 != 2; newPacket_00 = newPacket_00 + 1) {
              IVar4 = composeState(this,IVar2,newPacket_00);
              *yVals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start = IVar4;
              dVar12 = backlogToReward(this,IVar2);
              FactoredDecPOMDPDiscrete::SetRewardForLRF
                        (&this->super_FactoredDecPOMDPDiscrete,uVar3,(Scope *)&bI,&emptyVec,
                         (Scope *)&bI,&emptyVec,(Scope *)&newPacket,&yVals,(Scope *)&bI,&emptyVec,
                         dVar12);
            }
          }
          else if (iVar1 == 0) {
            *yVals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start = IVar2;
            dVar12 = backlogToReward(this,IVar2);
            FactoredDecPOMDPDiscrete::SetRewardForLRF
                      (&this->super_FactoredDecPOMDPDiscrete,uVar3,(Scope *)&bI,&emptyVec,
                       (Scope *)&bI,&emptyVec,(Scope *)&newPacket,&yVals,(Scope *)&bI,&emptyVec,
                       dVar12);
          }
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&yVals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&emptyVec);
          uVar9 = (ulong)(IVar2 + 1);
        }
        std::__cxx11::string::~string((string *)&ySc);
        std::__cxx11::string::~string((string *)&ss);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&newPacket);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bI);
      }
      MultiAgentDecisionProcessDiscreteFactoredStates::SetInitialized
                ((MultiAgentDecisionProcessDiscreteFactoredStates *)this,true);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return;
    }
    IVar2 = *(Index *)&(this->super_FactoredDecPOMDPDiscrete).field_0x708;
    if (IVar2 - 1 < 3) {
      IVar2 = composeState(this,0,0);
LAB_00454399:
      FSDist_COF::SetProbability(this_00,(Index)uVar9,IVar2,1.0);
    }
    else if (IVar2 == 0) goto LAB_00454399;
    uVar9 = (ulong)((Index)uVar9 + 1);
  } while( true );
}

Assistant:

void ProblemAloha::InitializeAloha()
{
    SetSparse(true);

    /* -----------'ConstructNrAgents()' ------- */
    switch(_m_islandConf)
    {
    case OneIsland:
        _m_nrIslands=1;
        break;
    case TwoIslands:
    case TwoIndependentIslands:
        _m_nrIslands=2;
        break;
    case ThreeIslandsInLine:
    case ThreeIslandsClustered:
    case SmallBigSmallInLine:
        _m_nrIslands=3;
        break;
    case FourIslandsInLine:
    case FourIslandsInSquare:
        _m_nrIslands=4;
        break;
    case FiveIslandsInLine:
        _m_nrIslands=5;
        break;
    case SixIslandsInLine:
        _m_nrIslands=6;
        break;
    case SevenIslandsInLine:
        _m_nrIslands=7;
        break;
    case InLine:
        _m_nrIslands=_m_nrAgentsPassedOnCommandline;
        break;
    default:
        throw(E("InitializeAloha() island config not handled"));
    }
    SetNrAgents(_m_nrIslands);

    // first we need to set the number of agents before the
    // SoftPrintBriefDescription() is correct
    SetName(SoftPrintBriefDescription());
    SetDescription(SoftPrintDescription());
    SetUnixName(SoftPrintBriefDescription());

    vector<size_t> nrElems(2);
    nrElems[0]=_m_maxBacklog;
    nrElems[1]=2; // yes or no
    _m_stepSizeState=IndexTools::CalculateStepSize(nrElems);
    nrElems[0]=3;
    nrElems[1]=2; // yes or no
    _m_stepSizeObservations=IndexTools::CalculateStepSize(nrElems);

    /* 
     * -----------'ConstructStateSpace() -------
     */
    for(Index iI = 0; iI < _m_nrIslands; iI++)
    {
        Index sfI = AddStateFactor( 
                StringTools::Append("BL",iI) , 
                StringTools::Append("The back log of island ",iI));

        switch(_m_variation)
        {
        case NewPacket:
        case NewPacketSendAll:
        case NewPacketProgressivePenalty:
        {
            for(Index sI=0;sI!=(_m_maxBacklog+1)*2;++sI)
            {
                Index bI,newPacket;
                splitState(sI,bI,newPacket);
                stringstream ss;
                ss << "bl" << bI;
                if(newPacket)
                    ss << "newP";
                else
                    ss << "none";
                
                AddStateFactorValue(sfI, ss.str());
            }
            break;
        }
        case NoNewPacket:
        {
            for(Index bI=0; bI <= _m_maxBacklog; bI++)
                AddStateFactorValue(sfI,
                                    StringTools::Append("bl",bI));
            break;
        }
        }
    }

    SetStatesInitialized(true);


    /*-----------'ConstructInitialStateDistribution' ------- */
    //after initialization we can add the ISD:
    FSDist_COF *isd=
        new FSDist_COF(*this);
    for(Index iI = 0; iI < _m_nrIslands; iI++)
    {
        switch(_m_variation)
        {
        case NewPacket:
        case NewPacketSendAll:
        case NewPacketProgressivePenalty:
            // each island starts with backlog 0 and no new packet
            isd->SetProbability(iI,composeState(0,0),1.0); 
            break;
        case NoNewPacket:
            isd->SetProbability(iI,0,1.0); // each island starts with backlog 0
            break;
        }
    }
    SetISD(isd);

// add actions:
    ConstructActions();
#if 0 // for factored models we typically don't want to use joint indices
    ConstructJointActions();
#endif
    SetActionsInitialized(true);

// add observations:
    ConstructObservations();
#if 0 // for factored models we typically don't want to use joint indices
    ConstructJointObservations();
#endif
    SetObservationsInitialized(true);

    // Initialize the 2DBN in MultiAgentDecisionProcessDiscreteFactoredStates
    Initialize2DBN();

//    cout << ">>>Trans./obs. models created"<<endl;
//    cout << _m_2dbn.SoftPrint();


//add rewards
    SetNrLRFs(_m_nrIslands);
    //first add scope for each reward function
    for(Index e=0; e < _m_nrIslands; e++)
    {
        //cout << "Setting scope for reward function e=" << e << endl;
        //Add scope
        Scope emptySc;
        Scope ySc;
        ySc.Insert(e);//reward e depends on backlog of island e
        Scope aSc;
        aSc.Insert(e); // this seems necessary...
        SetScopeForLRF(e, emptySc, aSc, ySc, emptySc);
        //const Scope& agSC = GetAgentScopeForLRF(e);
        //cout << "agent scope = " << agSC.SoftPrint();
    }
    // compute some bookkeeping from the scopes
    InitializeInstantiationInformation();

    // now we add the reward functions themselves
    for(Index e=0; e < _m_nrIslands; e++)
    {
        //cout << "Adding reward function e=" << e << endl;
        Scope emptySc;
        Scope ySc;
        ySc.Insert(e);//reward e depends on backlog of island e
        const Scope& sfSC = GetStateFactorScopeForLRF(e);
        const Scope& agSC = GetAgentScopeForLRF(e);
        string sf_descr = sfSC.SoftPrint();
        string ag_descr = agSC.SoftPrint();
        //the number of X instantiations (the size of the 'local' state space)
        size_t nrXIs = GetNrXIs(e);
        size_t nrAIs = GetNrAIs(e);
#if 0
        cout << "nrXIs " << nrXIs << " nrAIs " << nrAIs << " agSC " << agSC
             << " sfSC " << sfSC << endl;
#endif
        RewardModelMapping* RMe = 
            new RewardModelMapping(nrXIs, nrAIs, sf_descr, ag_descr);
        SetRM(e, RMe);
        
        for(Index bI=0; bI <= _m_maxBacklog; bI++)
        {
            vector<Index> emptyVec;
            vector<Index> yVals(1);
            
            switch(_m_variation)
            {
            case NewPacket:
            case NewPacketSendAll:
            case NewPacketProgressivePenalty:
            {
                for(Index j=0;j!=2;++j)
                {
                    yVals[0]=composeState(bI,j);
                    SetRewardForLRF(  e,
                                      emptySc, emptyVec, //X scope + value
                                      emptySc, emptyVec, //A scope + value
                                      ySc, yVals,        //Y scope + value
                                      emptySc, emptyVec, //O scope + value
                                      backlogToReward(bI) //the reward
                        );
                }
                break;
            }
            case NoNewPacket:
            {
                yVals[0]=bI;
                SetRewardForLRF(  e,
                                  emptySc, emptyVec, //X scope + value
                                  emptySc, emptyVec, //A scope + value
                                  ySc, yVals,        //Y scope + value
                                  emptySc, emptyVec, //O scope + value
                                  backlogToReward(bI) //the reward
                    );
                break;
            }
            }
        }
    }

    FactoredDecPOMDPDiscrete::SetInitialized(true);
}